

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

void vera::splitFacesFromHorizontalCross<float>
               (float *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<float> **_faces)

{
  undefined1 auVar1 [16];
  CubemapFace<float> *pCVar2;
  float *pfVar3;
  ulong uVar4;
  CubemapFace<float> **ppCVar5;
  int iVar6;
  int iVar7;
  int i;
  long lVar8;
  ulong uVar9;
  int iVar10;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = _height;
  iVar10 = (int)(_width >> 2);
  iVar6 = SUB164(auVar1 / ZEXT816(3),0);
  uVar4 = (long)iVar6 * (long)iVar10 * _channels;
  for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
    pCVar2 = (CubemapFace<float> *)operator_new(0x18);
    pCVar2->data = (float *)0x0;
    pCVar2->id = 0;
    pCVar2->width = 0;
    pCVar2->height = 0;
    pCVar2->currentOffset = 0;
    _faces[lVar8] = pCVar2;
    pCVar2->id = (int)lVar8;
    pfVar3 = (float *)operator_new__(-(ulong)(uVar4 >> 0x3e != 0) | uVar4 * 4);
    pCVar2->data = pfVar3;
    pCVar2->width = iVar10;
    pCVar2->height = iVar6;
    pCVar2->currentOffset = 0;
  }
  for (uVar4 = 0; uVar4 != _height; uVar4 = uVar4 + 1) {
    uVar9 = 0;
    lVar8 = 2;
    while (lVar8 != -2) {
      iVar7 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                   (long)iVar6);
      ppCVar5 = _faces;
      if (((((iVar7 == 1 && lVar8 == 0) || (ppCVar5 = _faces + 1, iVar7 == 1 && lVar8 == 2)) ||
           (ppCVar5 = _faces + 2, iVar7 == 0 && lVar8 == 1)) ||
          (((ppCVar5 = _faces + 3, iVar7 == 2 && lVar8 == 1 ||
            (ppCVar5 = _faces + 4, iVar7 == 1 && lVar8 == 1)) ||
           (ppCVar5 = _faces + 5, lVar8 == -1 && iVar7 == 1)))) &&
         (pCVar2 = *ppCVar5, pCVar2 != (CubemapFace<float> *)0x0)) {
        memcpy(pCVar2->data + pCVar2->currentOffset,
               (void *)(((long)(((uVar9 & 0xffffffff) + uVar4 * _width) * (_channels << 0x20)) >>
                        0x1e) + (long)_data),
               (long)((ulong)((uint)_width & 0xfffffffc) * (_channels << 0x20)) >> 0x20);
        pCVar2->currentOffset = pCVar2->currentOffset + (int)_channels * iVar10;
      }
      uVar9 = uVar9 + (_width >> 2);
      lVar8 = lVar8 + -1;
    }
  }
  return;
}

Assistant:

void splitFacesFromHorizontalCross(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    int faceWidth = _width / 4;
    int faceHeight = _height / 3;

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[_channels * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;
    }

    for (int l = 0; l < _height; l++) {
        int jFace = (l - (l % faceHeight)) / faceHeight;

        for (int iFace = 0; iFace < 4; iFace++) {
            CubemapFace<T> *face = NULL;
            int offset = _channels * (faceWidth * iFace + l * _width);

            //      0   1   2   3 i      
            //  2      -X 
            //  1  -Y  +Z  +Y  -Z     
            //  0      +X
            //  j
            //
            if (iFace == 2 && jFace == 1) face = _faces[0]; // POS_Y
            if (iFace == 0 && jFace == 1) face = _faces[1]; // NEG_Y
            if (iFace == 1 && jFace == 0) face = _faces[2]; // POS_X
            if (iFace == 1 && jFace == 2) face = _faces[3]; // NEG_X
            if (iFace == 1 && jFace == 1) face = _faces[4]; // POS_Z
            if (iFace == 3 && jFace == 1) face = _faces[5]; // NEG_Z

            if (face) {
                // the number of components to copy
                int n = sizeof(T) * faceWidth * _channels;

                std::memcpy(face->data + face->currentOffset, _data + offset, n);
                face->currentOffset += (_channels * faceWidth);
            }
        }
    }
}